

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O3

void __thiscall TApp_IniNoSubFailure_Test::TestBody(TApp_IniNoSubFailure_Test *this)

{
  bool bVar1;
  TempFile tmpini;
  ofstream out;
  AssertHelper AStack_2c8;
  TempFile local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"TestIniTmp.ini","");
  TempFile::TempFile(&local_2c0,&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"--config","");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,local_2c0._name._M_dataplus._M_p,
             local_2c0._name._M_dataplus._M_p + local_2c0._name._M_string_length);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Read an ini file","");
  CLI::App::set_config(&(this->super_TApp).app,&local_260,&local_280,&local_2a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  std::ofstream::ofstream(&local_220,(string *)&local_2c0,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"[other]",7);
  std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220.ptr_ + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"val=1",5);
  std::ios::widen((char)(ostream *)&local_220 + (char)*(undefined8 *)(local_220.ptr_ + -0x18));
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  local_220.ptr_ = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&local_220);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0x1bd,
             "Expected: run() throws an exception of type CLI::INIError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_2c8,(Message *)&local_220);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2c8);
  if (local_220.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_220.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_220.ptr_ + 8))();
    }
  }
  remove(local_2c0._name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._name._M_dataplus._M_p != &local_2c0._name.field_2) {
    operator_delete(local_2c0._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST_F(TApp, IniNoSubFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[other]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}